

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O2

string * __thiscall
tcu::formatError_abi_cxx11_
          (string *__return_storage_ptr__,tcu *this,char *message,char *expr,char *file,int line)

{
  ostream *poVar1;
  char *pcVar2;
  FilePath FStack_1e8;
  string local_1c8;
  ostringstream msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  pcVar2 = "Runtime check failed";
  if (this != (tcu *)0x0) {
    pcVar2 = (char *)this;
  }
  std::operator<<((ostream *)&msg,pcVar2);
  if (message != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&msg,": \'");
    poVar1 = std::operator<<(poVar1,message);
    std::operator<<(poVar1,'\'');
  }
  if (expr != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)&msg," at ");
    de::FilePath::FilePath(&FStack_1e8,expr);
    de::FilePath::getBaseName_abi_cxx11_(&local_1c8,&FStack_1e8);
    poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
    poVar1 = std::operator<<(poVar1,":");
    std::ostream::operator<<(poVar1,(int)file);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&FStack_1e8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  return __return_storage_ptr__;
}

Assistant:

static std::string formatError (const char* message, const char* expr, const char* file, int line)
{
	std::ostringstream msg;
	msg << (message ? message : "Runtime check failed");

	if (expr)
		msg << ": '" << expr << '\'';

	if (file)
		msg << " at " << de::FilePath(file).getBaseName() << ":" << line;

	return msg.str();
}